

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegionChecker.cpp
# Opt level: O1

void __thiscall RegionChecker::add(RegionChecker *this,size_t from,size_t to)

{
  ulong *puVar1;
  long lVar2;
  ostream *poVar3;
  ulong uVar4;
  
  if (from < to) {
    lVar2 = (long)(this->usedBits).super__Bvector_base<std::allocator<bool>_>._M_impl.
                  super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p;
    do {
      uVar4 = from + 0x3f;
      if (-1 < (long)from) {
        uVar4 = from;
      }
      puVar1 = (ulong *)(lVar2 + ((long)uVar4 >> 6) * 8 + -8 +
                        (ulong)((from & 0x800000000000003f) < 0x8000000000000001) * 8);
      *puVar1 = *puVar1 | 1L << ((byte)from & 0x3f);
      from = from + 1;
    } while (to != from);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Added region [",0xe);
  poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,", ",2);
  poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,")",1);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
  std::ostream::put((char)poVar3);
  std::ostream::flush();
  return;
}

Assistant:

void RegionChecker::add(size_t from, size_t to) {
	for (size_t i = from; i < to; i++) {
		usedBits[i] = true;
	}

	std::cout << "Added region [" << from << ", " << to << ")" << std::endl;
}